

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image-loader.cc
# Opt level: O1

expected<tinyusdz::image::ImageInfoResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* tinyusdz::image::GetImageInfoFromMemory
            (expected<tinyusdz::image::ImageInfoResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *__return_storage_ptr__,uint8_t *addr,size_t sz,string *uri)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string *psVar2;
  stbi__context *psVar3;
  bool bVar4;
  stbi_uc **ppsVar5;
  bool bVar6;
  undefined8 *puVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  stbi__jpeg *z;
  stbi__gif *g;
  void *pvVar11;
  byte *pbVar12;
  long *in_FS_OFFSET;
  int h;
  int w;
  ImageInfoResult ret;
  string err;
  uint local_1a0;
  uint local_19c;
  uint local_198;
  undefined4 local_194;
  uint local_190;
  uint local_18c;
  stbi__context local_188;
  stbi__uint32 local_a8;
  stbi__uint32 sStack_a4;
  uint32_t local_a0;
  char *local_98;
  size_type local_90;
  char local_88;
  undefined7 uStack_87;
  undefined8 uStack_80;
  undefined1 *local_78;
  long local_70;
  undefined1 local_68;
  undefined7 uStack_67;
  stbi__png local_58;
  
  local_90 = 0;
  local_88 = '\0';
  local_70 = 0;
  local_68 = 0;
  local_98 = &local_88;
  local_78 = &local_68;
  iVar8 = IsEXRFromMemory(addr,sz);
  if (iVar8 == 0) {
    local_188._0_8_ = "TODO: EXR format";
    nonstd::expected_lite::
    expected<tinyusdz::image::ImageInfoResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::expected<const_char_*,_0>(__return_storage_ptr__,(unexpected_type<const_char_*> *)&local_188);
    goto LAB_00452a71;
  }
  local_198 = 0;
  local_19c = 0;
  local_1a0 = 0;
  local_188.io.read = (_func_int_void_ptr_char_ptr_int *)0x0;
  local_188.read_from_callbacks = 0;
  local_188.callback_already_read = 0;
  local_188.img_buffer_end = addr + (int)sz;
  local_188.img_buffer = addr;
  local_188.img_buffer_original = addr;
  local_188.img_buffer_original_end = local_188.img_buffer_end;
  z = (stbi__jpeg *)malloc(0x4888);
  if (z == (stbi__jpeg *)0x0) {
    *(char **)(*in_FS_OFFSET + -8) = "outofmem";
LAB_0045289e:
    local_58.s = &local_188;
    iVar8 = stbi__parse_png_file(&local_58,2,0);
    psVar3 = local_58.s;
    if (iVar8 == 0) {
      ppsVar5 = &(local_58.s)->img_buffer_original_end;
      (local_58.s)->img_buffer = (local_58.s)->img_buffer_original;
      psVar3->img_buffer_end = *ppsVar5;
    }
    else {
      local_198 = (local_58.s)->img_x;
      local_19c = (local_58.s)->img_y;
      local_1a0 = (local_58.s)->img_n;
    }
    bVar4 = true;
    if (iVar8 == 0) {
      g = (stbi__gif *)malloc(0x8870);
      if (g == (stbi__gif *)0x0) {
        *(char **)(*in_FS_OFFSET + -8) = "outofmem";
      }
      else {
        iVar8 = stbi__gif_header(&local_188,g,(int *)&local_1a0,1);
        if (iVar8 != 0) {
          local_198 = g->w;
          local_19c = g->h;
          free(g);
          goto LAB_004528f3;
        }
        free(g);
        local_188.img_buffer = local_188.img_buffer_original;
        local_188.img_buffer_end = local_188.img_buffer_original_end;
      }
      local_58.out._4_4_ = 0xff;
      pvVar11 = stbi__bmp_parse_header(&local_188,(stbi__bmp_data *)&local_58);
      if (pvVar11 == (void *)0x0) {
        local_188.img_buffer = local_188.img_buffer_original;
        local_188.img_buffer_end = local_188.img_buffer_original_end;
      }
      else {
        local_198 = local_188.img_x;
        local_19c = local_188.img_y;
        if ((int)local_58.out == -0x1000000 && (int)local_58.s == 0x18) {
          local_1a0 = 3;
        }
        else {
          local_1a0 = 4 - ((int)local_58.out == 0);
        }
      }
      if (pvVar11 == (void *)0x0) {
        iVar8 = stbi__get16be(&local_188);
        uVar9 = stbi__get16be(&local_188);
        if (((uVar9 | iVar8 << 0x10) == 0x38425053) &&
           (iVar8 = stbi__get16be(&local_188), iVar8 == 1)) {
          if (local_188.io.read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_00452be7:
            local_188.img_buffer = local_188.img_buffer + 6;
          }
          else {
            iVar8 = (int)local_188.img_buffer_end - (int)local_188.img_buffer;
            if (5 < iVar8) goto LAB_00452be7;
            local_188.img_buffer = local_188.img_buffer_end;
            (*local_188.io.skip)(local_188.io_user_data,6 - iVar8);
          }
          uVar9 = stbi__get16be(&local_188);
          if (uVar9 < 0x11) {
            iVar8 = stbi__get16be(&local_188);
            uVar9 = stbi__get16be(&local_188);
            local_19c = iVar8 << 0x10 | uVar9;
            iVar8 = stbi__get16be(&local_188);
            uVar9 = stbi__get16be(&local_188);
            local_198 = iVar8 << 0x10 | uVar9;
            iVar8 = stbi__get16be(&local_188);
            if (((iVar8 == 0x10) || (iVar8 == 8)) && (iVar8 = stbi__get16be(&local_188), iVar8 == 3)
               ) {
              local_1a0 = 4;
              goto LAB_004528f3;
            }
          }
        }
        local_188.img_buffer = local_188.img_buffer_original;
        local_188.img_buffer_end = local_188.img_buffer_original_end;
        iVar8 = stbi__pic_is4(&local_188,anon_var_dwarf_170dca4);
        if (iVar8 != 0) {
          if (local_188.io.read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_00452cc9:
            local_188.img_buffer = local_188.img_buffer + 0x58;
          }
          else {
            iVar8 = (int)local_188.img_buffer_end - (int)local_188.img_buffer;
            if (0x57 < iVar8) goto LAB_00452cc9;
            local_188.img_buffer = local_188.img_buffer_end;
            (*local_188.io.skip)(local_188.io_user_data,0x58 - iVar8);
          }
          local_198 = stbi__get16be(&local_188);
          local_19c = stbi__get16be(&local_188);
          if (local_188.io.read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_00452d0a:
            if (local_188.img_buffer_end <= local_188.img_buffer) goto LAB_00452d3b;
          }
          else {
            iVar8 = (*local_188.io.eof)(local_188.io_user_data);
            if (iVar8 != 0) {
              if (local_188.read_from_callbacks == 0) goto LAB_00452d3b;
              goto LAB_00452d0a;
            }
          }
          if ((local_198 == 0) || ((int)local_19c <= (int)(0x10000000 / (long)(int)local_198))) {
            pbVar12 = (byte *)(ulong)local_198;
            if (local_188.io.read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_00452e0a:
              local_188.img_buffer = local_188.img_buffer + 8;
            }
            else {
              iVar8 = (int)local_188.img_buffer_end - (int)local_188.img_buffer;
              pbVar12 = local_188.img_buffer_end;
              if (7 < iVar8) goto LAB_00452e0a;
              local_188.img_buffer = local_188.img_buffer_end;
              (*local_188.io.skip)(local_188.io_user_data,8 - iVar8);
            }
            puVar7 = (undefined8 *)local_188.buffer_start;
            local_18c = 0;
            iVar8 = 0;
            do {
              if (iVar8 == 10) {
                bVar6 = false;
              }
              else {
                pbVar12 = local_188.img_buffer;
                if (local_188.img_buffer < local_188.img_buffer_end) {
LAB_00452eb7:
                  local_188.img_buffer = pbVar12 + 1;
                  local_190 = (uint)*pbVar12;
                }
                else {
                  if (local_188.read_from_callbacks != 0) {
                    iVar10 = (*local_188.io.read)
                                       (local_188.io_user_data,(char *)puVar7,local_188.buflen);
                    local_188.callback_already_read =
                         local_188.callback_already_read +
                         ((int)local_188.img_buffer - (int)local_188.img_buffer_original);
                    pbVar12 = (byte *)puVar7;
                    if (iVar10 == 0) {
                      local_188.read_from_callbacks = 0;
                      local_188.img_buffer_end = (stbi_uc *)((long)local_188.buffer_start + 1);
                      local_188.buffer_start[0] = '\0';
                    }
                    else {
                      local_188.img_buffer_end = (stbi_uc *)((long)puVar7 + (long)iVar10);
                    }
                    goto LAB_00452eb7;
                  }
                  local_190 = 0;
                }
                pbVar12 = local_188.img_buffer;
                if (local_188.img_buffer < local_188.img_buffer_end) {
LAB_00452f57:
                  local_188.img_buffer = pbVar12 + 1;
                  local_194 = (undefined4)CONCAT71((int7)((ulong)pbVar12 >> 8),*pbVar12 == 8);
                }
                else {
                  if (local_188.read_from_callbacks != 0) {
                    iVar10 = (*local_188.io.read)
                                       (local_188.io_user_data,(char *)puVar7,local_188.buflen);
                    local_188.callback_already_read =
                         local_188.callback_already_read +
                         ((int)local_188.img_buffer - (int)local_188.img_buffer_original);
                    pbVar12 = (byte *)puVar7;
                    if (iVar10 == 0) {
                      local_188.read_from_callbacks = 0;
                      local_188.img_buffer_end = (stbi_uc *)((long)local_188.buffer_start + 1);
                      local_188.buffer_start[0] = '\0';
                    }
                    else {
                      local_188.img_buffer_end = (stbi_uc *)((long)puVar7 + (long)iVar10);
                    }
                    goto LAB_00452f57;
                  }
                  local_194 = 0;
                }
                if (local_188.img_buffer < local_188.img_buffer_end) {
LAB_00452ff0:
                  local_188.img_buffer = local_188.img_buffer + 1;
                }
                else if (local_188.read_from_callbacks != 0) {
                  iVar10 = (*local_188.io.read)
                                     (local_188.io_user_data,(char *)puVar7,local_188.buflen);
                  local_188.callback_already_read =
                       local_188.callback_already_read +
                       ((int)local_188.img_buffer - (int)local_188.img_buffer_original);
                  local_188.img_buffer = (stbi_uc *)puVar7;
                  if (iVar10 == 0) {
                    local_188.read_from_callbacks = 0;
                    local_188.img_buffer_end = (stbi_uc *)((long)local_188.buffer_start + 1);
                    local_188.buffer_start[0] = '\0';
                  }
                  else {
                    local_188.img_buffer_end = (stbi_uc *)((long)puVar7 + (long)iVar10);
                  }
                  goto LAB_00452ff0;
                }
                pbVar12 = local_188.img_buffer;
                if (local_188.img_buffer < local_188.img_buffer_end) {
LAB_00453082:
                  local_188.img_buffer = pbVar12 + 1;
                  uVar9 = (uint)*pbVar12;
                }
                else {
                  if (local_188.read_from_callbacks != 0) {
                    iVar10 = (*local_188.io.read)
                                       (local_188.io_user_data,(char *)puVar7,local_188.buflen);
                    local_188.callback_already_read =
                         local_188.callback_already_read +
                         ((int)local_188.img_buffer - (int)local_188.img_buffer_original);
                    pbVar12 = (byte *)puVar7;
                    if (iVar10 == 0) {
                      local_188.read_from_callbacks = 0;
                      local_188.img_buffer_end = (stbi_uc *)((long)local_188.buffer_start + 1);
                      local_188.buffer_start[0] = '\0';
                    }
                    else {
                      local_188.img_buffer_end = (stbi_uc *)((long)puVar7 + (long)iVar10);
                    }
                    goto LAB_00453082;
                  }
                  uVar9 = 0;
                }
                iVar8 = iVar8 + 1;
                local_18c = local_18c | uVar9;
                if (local_188.io.read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_004530b4:
                  bVar6 = true;
                  if (((byte)local_194 & local_188.img_buffer < local_188.img_buffer_end) == 0)
                  goto LAB_004530cf;
                }
                else {
                  iVar10 = (*local_188.io.eof)(local_188.io_user_data);
                  if (iVar10 == 0) {
                    bVar6 = true;
                    if ((byte)local_194 != '\0') goto LAB_004530e1;
                  }
                  else if (local_188.read_from_callbacks != 0) goto LAB_004530b4;
LAB_004530cf:
                  local_188.img_buffer = local_188.img_buffer_original;
                  local_188.img_buffer_end = local_188.img_buffer_original_end;
                  bVar6 = false;
                }
LAB_004530e1:
                pbVar12 = (byte *)(ulong)local_190;
              }
              if (!bVar6) goto LAB_00452d4b;
            } while ((int)pbVar12 != 0);
            local_1a0 = 4 - ((local_18c & 0x10) == 0);
            goto LAB_004528f3;
          }
        }
LAB_00452d3b:
        local_188.img_buffer = local_188.img_buffer_original;
        local_188.img_buffer_end = local_188.img_buffer_original_end;
LAB_00452d4b:
        iVar8 = stbi__pnm_info(&local_188,(int *)&local_198,(int *)&local_19c,(int *)&local_1a0);
        if (((iVar8 == 0) &&
            (iVar8 = stbi__hdr_info(&local_188,(int *)&local_198,(int *)&local_19c,(int *)&local_1a0
                                   ), iVar8 == 0)) &&
           (iVar8 = stbi__tga_info(&local_188,(int *)&local_198,(int *)&local_19c,(int *)&local_1a0)
           , iVar8 == 0)) {
          *(char **)(*in_FS_OFFSET + -8) = "unknown image type";
          bVar4 = false;
        }
      }
    }
  }
  else {
    memset(z,0,0x4888);
    z->s = &local_188;
    iVar8 = stbi__decode_jpeg_header(z,2);
    psVar3 = z->s;
    if (iVar8 == 0) {
      psVar3->img_buffer = psVar3->img_buffer_original;
      psVar3->img_buffer_end = psVar3->img_buffer_original_end;
    }
    else {
      local_198 = psVar3->img_x;
      local_19c = psVar3->img_y;
      local_1a0 = (uint)(2 < psVar3->img_n) * 2 + 1;
    }
    free(z);
    bVar4 = true;
    if (iVar8 == 0) goto LAB_0045289e;
  }
LAB_004528f3:
  if ((int)local_198 < 0) {
    local_198 = 0;
  }
  if ((int)local_19c < 0) {
    local_19c = 0;
  }
  if ((int)local_1a0 < 0) {
    local_1a0 = 0;
  }
  if (bVar4) {
    local_a8 = local_198;
    sStack_a4 = local_19c;
    local_a0 = local_1a0;
    (__return_storage_ptr__->contained).
    super_storage_t_impl<tinyusdz::image::ImageInfoResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .m_has_value = true;
    (__return_storage_ptr__->contained).
    super_storage_t_impl<tinyusdz::image::ImageInfoResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .field_0.m_error._M_dataplus._M_p = (pointer)CONCAT44(local_19c,local_198);
    (__return_storage_ptr__->contained).
    super_storage_t_impl<tinyusdz::image::ImageInfoResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .field_0.m_value.channels = local_1a0;
    paVar1 = &(__return_storage_ptr__->contained).
              super_storage_t_impl<tinyusdz::image::ImageInfoResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              .field_0.m_value.warning.field_2;
    *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      **)((long)&(__return_storage_ptr__->contained).
                 super_storage_t_impl<tinyusdz::image::ImageInfoResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 .field_0 + 0x10) = paVar1;
    if (local_98 == &local_88) {
      paVar1->_M_allocated_capacity = CONCAT71(uStack_87,local_88);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->contained).
               super_storage_t_impl<tinyusdz::image::ImageInfoResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               .field_0.m_value.warning.field_2 + 8) = uStack_80;
    }
    else {
      (__return_storage_ptr__->contained).
      super_storage_t_impl<tinyusdz::image::ImageInfoResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .field_0.m_value.warning._M_dataplus._M_p = local_98;
      (__return_storage_ptr__->contained).
      super_storage_t_impl<tinyusdz::image::ImageInfoResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .field_0.m_value.warning.field_2._M_allocated_capacity = CONCAT71(uStack_87,local_88);
    }
    (__return_storage_ptr__->contained).
    super_storage_t_impl<tinyusdz::image::ImageInfoResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .field_0.m_value.warning._M_string_length = local_90;
    local_90 = 0;
    local_88 = '\0';
    local_98 = &local_88;
  }
  else {
    local_188._0_8_ = &local_188.io;
    ::std::__cxx11::string::_M_construct<char*>((string *)&local_188,local_78,local_78 + local_70);
    (__return_storage_ptr__->contained).
    super_storage_t_impl<tinyusdz::image::ImageInfoResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .m_has_value = false;
    psVar2 = &(__return_storage_ptr__->contained).
              super_storage_t_impl<tinyusdz::image::ImageInfoResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              .field_0.m_value.warning;
    *(string **)
     &(__return_storage_ptr__->contained).
      super_storage_t_impl<tinyusdz::image::ImageInfoResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .field_0 = psVar2;
    if ((stbi_io_callbacks *)local_188._0_8_ == &local_188.io) {
      (psVar2->_M_dataplus)._M_p = (pointer)local_188.io.read;
      (__return_storage_ptr__->contained).
      super_storage_t_impl<tinyusdz::image::ImageInfoResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .field_0.m_value.warning._M_string_length = (size_type)local_188.io.skip;
    }
    else {
      (__return_storage_ptr__->contained).
      super_storage_t_impl<tinyusdz::image::ImageInfoResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .field_0.m_error._M_dataplus._M_p = (pointer)local_188._0_8_;
      (__return_storage_ptr__->contained).
      super_storage_t_impl<tinyusdz::image::ImageInfoResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .field_0.m_value.warning._M_dataplus._M_p = (pointer)local_188.io.read;
    }
    (__return_storage_ptr__->contained).
    super_storage_t_impl<tinyusdz::image::ImageInfoResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .field_0.m_error._M_string_length = local_188._8_8_;
  }
LAB_00452a71:
  if (local_78 != &local_68) {
    operator_delete(local_78,CONCAT71(uStack_67,local_68) + 1);
  }
  if (local_98 != &local_88) {
    operator_delete(local_98,CONCAT71(uStack_87,local_88) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::expected<image::ImageInfoResult, std::string> GetImageInfoFromMemory(
    const uint8_t *addr, size_t sz, const std::string &uri) {
  image::ImageInfoResult ret;
  std::string err;

#if defined(TINYUSDZ_WITH_EXR)
  if (TINYEXR_SUCCESS == IsEXRFromMemory(addr, sz)) {

    return nonstd::make_unexpected("TODO: EXR format");
  }
#endif

#if defined(TINYUSDZ_WITH_TIFF)
  if (tinydng::IsDNGFromMemory(reinterpret_cast<const char *>(addr), uint32_t(sz), &err)) {

      return nonstd::make_unexpected("TODO: TIFF/DNG format");

  }
#endif

#if defined(TINYUSDZ_USE_WUFFS_IMAGE_LOADER)
  bool ok = GetImageInfoWUFF(addr, sz, uri, &ret.width, &ret.height, &ret.channels, &ret.warning, &err);
#elif !defined(TINYUSDZ_NO_BUILTIN_IMAGE_LOADER)
  bool ok = GetImageInfoSTB(addr, sz, uri, &ret.width, &ret.height, &ret.channels, &ret.warning, &err);
#else
  (void)addr;
  (void)sz;
  (void)uri;
  bool ok = false;
  err = "Image loading feature is disabled in this build. TODO: use user-supplied image info function\n";
#endif
  if (!ok) {
    return nonstd::make_unexpected(err);
  }

  return std::move(ret);
}